

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

size_t __thiscall
obx::Box<objectbox::tsdemo::SensorValues>::
putMany<std::vector<objectbox::tsdemo::SensorValues,std::allocator<objectbox::tsdemo::SensorValues>>>
          (Box<objectbox::tsdemo::SensorValues> *this,
          vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
          *objects,vector<unsigned_long,_std::allocator<unsigned_long>_> *outIds,OBXPutMode mode)

{
  pointer puVar1;
  pointer pSVar2;
  OBX_cursor *pOVar3;
  FlatBufferBuilder *fbb;
  uint8_t *puVar4;
  uint64_t id_00;
  SensorValues *object;
  pointer object_00;
  size_t sVar5;
  obx_id id;
  CursorTx cursor;
  
  if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    puVar1 = (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (outIds->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (outIds,((long)(objects->
                             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(objects->
                            super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  }
  if ((objects->
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (objects->
      super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    sVar5 = 0;
  }
  else {
    anon_unknown_3::CursorTx::CursorTx(&cursor,WRITE,(this->super_BoxTypeless).store_,2);
    fbb = internal::threadLocalFbbDirty();
    pSVar2 = (objects->
             super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar5 = 0;
    for (object_00 = (objects->
                     super__Vector_base<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
                     )._M_impl.super__Vector_impl_data._M_start; object_00 != pSVar2;
        object_00 = object_00 + 1) {
      objectbox::tsdemo::SensorValues::_OBX_MetaInfo::toFlatBuffer(fbb,object_00);
      pOVar3 = cursor.cCursor_;
      puVar4 = flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(fbb);
      id_00 = obx_cursor_put_object4(pOVar3,puVar4,(fbb->buf_).size_,mode);
      internal::checkIdOrThrow(id_00,(char *)0x0);
      object_00->id = id_00;
      id = id_00;
      if (outIds != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(outIds,&id);
      }
      sVar5 = (sVar5 + 1) - (ulong)(id == 0);
    }
    internal::threadLocalFbbDone();
    if (cursor.cCursor_ == (OBX_cursor *)0x0) {
      internal::throwIllegalStateException("State condition failed: ","cCursor_");
    }
    obx_cursor_close();
    cursor.cCursor_ = (OBX_cursor *)0x0;
    Transaction::success(&cursor.tx_);
    anon_unknown_3::CursorTx::~CursorTx(&cursor);
  }
  return sVar5;
}

Assistant:

size_t putMany(Vector& objects, std::vector<obx_id>* outIds, OBXPutMode mode) {
        if (outIds) {
            outIds->clear();
            outIds->reserve(objects.size());
        }

        // Don't start a TX in case there's no data.
        // Note: Don't move this above clearing outIds vector - our contract says that we clear outIds before starting
        // execution, so we must do it even if no objects were passed.
        if (objects.empty()) return 0;

        size_t count = 0;
        CursorTx cursor(TxMode::WRITE, store_, EntityBinding::entityId());
        flatbuffers::FlatBufferBuilder& fbb = internal::threadLocalFbbDirty();

        for (auto& object : objects) {
            obx_id id = cursorPut(cursor, fbb, object, mode);  // type-based overloads below
            if (outIds) outIds->push_back(id);  // always include in outIds even if the item wasn't present (id == 0)
            if (id) count++;
        }
        internal::threadLocalFbbDone();  // NOTE might not get called in case of an exception
        cursor.commitAndClose();
        return count;
    }